

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O0

void __thiscall
glcts::SampleShadingRenderFormatTests::SampleShadingRenderFormatTests
          (SampleShadingRenderFormatTests *this,Context *context,GLSLVersion glslVersion,
          GLenum internalFormat,char *format,TextureFormat *texFormat,char *sampler,char *outType,
          GLfloat min,GLfloat max,char *extension)

{
  allocator<char> local_4e;
  allocator<char> local_4d [20];
  allocator<char> local_39;
  GLfloat local_38;
  GLfloat local_34;
  GLfloat max_local;
  GLfloat min_local;
  TextureFormat *texFormat_local;
  char *format_local;
  GLenum internalFormat_local;
  GLSLVersion glslVersion_local;
  Context *context_local;
  SampleShadingRenderFormatTests *this_local;
  
  local_38 = max;
  local_34 = min;
  _max_local = texFormat;
  texFormat_local = (TextureFormat *)format;
  format_local._0_4_ = internalFormat;
  format_local._4_4_ = glslVersion;
  _internalFormat_local = context;
  context_local = (Context *)this;
  deqp::TestCaseGroup::TestCaseGroup(&this->super_TestCaseGroup,context,format,"");
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SampleShadingRenderFormatTests_0325c440;
  this->m_glslVersion = format_local._4_4_;
  this->m_internalFormat = (GLenum)format_local;
  this->m_texFormat = *_max_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_sampler,sampler,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_outType,outType,local_4d);
  std::allocator<char>::~allocator(local_4d);
  this->m_min = local_34;
  this->m_max = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_extension,extension,&local_4e);
  std::allocator<char>::~allocator(&local_4e);
  return;
}

Assistant:

SampleShadingRenderFormatTests::SampleShadingRenderFormatTests(Context& context, glu::GLSLVersion glslVersion,
															   GLenum internalFormat, const char* format,
															   tcu::TextureFormat const& texFormat, const char* sampler,
															   const char* outType, GLfloat min, GLfloat max,
															   const char* extension)
	: TestCaseGroup(context, format, "")
	, m_glslVersion(glslVersion)
	, m_internalFormat(internalFormat)
	, m_texFormat(texFormat)
	, m_sampler(sampler)
	, m_outType(outType)
	, m_min(min)
	, m_max(max)
	, m_extension(extension)
{
}